

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::sc35_splice_info::print(sc35_splice_info *this,bool verbose)

{
  _Setw _Var1;
  ostream *poVar2;
  void *pvVar3;
  bool verbose_local;
  sc35_splice_info *this_local;
  
  if (verbose) {
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2," table id: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,(uint)this->table_id_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2," section_syntax_indicator: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,(bool)(this->section_syntax_indicator_ & 1));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2," private_indicator: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,(bool)(this->private_indicator_ & 1));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2," section_length: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,(uint)this->section_length_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2," protocol_version: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,(uint)this->protocol_version_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2," encrypted_packet: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,(bool)(this->encrypted_packet_ & 1));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2," encryption_algorithm: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,(uint)this->encryption_algorithm_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2," pts_adjustment: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,this->pts_adjustment_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2," cw_index: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,(uint)this->cw_index_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2," tier: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,this->tier_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2," splice_command_length: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,this->splice_command_length_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2," splice_command_type: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,(uint)this->splice_command_type_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2," descriptor_loop_length: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,this->descriptor_loop_length_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  _Var1 = Catch::clara::std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
  poVar2 = std::operator<<(poVar2," pts_adjustment: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,this->pts_adjustment_);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  _Var1 = Catch::clara::std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
  std::operator<<(poVar2," Command type: ");
  switch(this->splice_command_type_) {
  case '\0':
    std::ostream::operator<<(&std::cout,0);
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2," splice null ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case '\x04':
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2," splice schedule ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case '\x05':
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2," splice insert ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2," event_id: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,this->splice_insert_event_id_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2," cancel indicator: ");
    pvVar3 = (void *)std::ostream::operator<<
                               (poVar2,(bool)(this->splice_event_cancel_indicator_ & 1));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    break;
  case '\x06':
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2,"time signal ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case '\a':
    _Var1 = Catch::clara::std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)_Var1._M_n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Catch::clara::std::left);
    poVar2 = std::operator<<(poVar2,"bandwidth reservation ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void sc35_splice_info::print(bool verbose) const
	{
		if (verbose) {
			std::cout << std::setw(33) << std::left << " table id: " << (unsigned int)table_id_ << std::endl;
			std::cout << std::setw(33) << std::left << " section_syntax_indicator: " << section_syntax_indicator_ << std::endl;
			std::cout << std::setw(33) << std::left << " private_indicator: " << private_indicator_ << std::endl;
			std::cout << std::setw(33) << std::left << " section_length: " << (unsigned int)section_length_ << std::endl;
			std::cout << std::setw(33) << std::left << " protocol_version: " << (unsigned int)protocol_version_ << std::endl;
			std::cout << std::setw(33) << std::left << " encrypted_packet: " << encrypted_packet_ << std::endl;
			std::cout << std::setw(33) << std::left << " encryption_algorithm: " << (unsigned int)encryption_algorithm_ << std::endl;
			std::cout << std::setw(33) << std::left << " pts_adjustment: " << pts_adjustment_ << std::endl;
			std::cout << std::setw(33) << std::left << " cw_index: " << (unsigned int)cw_index_ << std::endl;
			std::cout << std::setw(33) << std::left << " tier: " << tier_ << std::endl;
			std::cout << std::setw(33) << std::left << " splice_command_length: " << splice_command_length_ << std::endl;
			std::cout << std::setw(33) << std::left << " splice_command_type: " << (unsigned int)splice_command_type_ << std::endl;
			std::cout << std::setw(33) << std::left << " descriptor_loop_length: " << descriptor_loop_length_ << std::endl;
		}
		std::cout << std::setw(33) << std::left << " pts_adjustment: " << pts_adjustment_ << std::endl;
		std::cout << std::setw(33) << std::left << " Command type: ";

		switch (splice_command_type_)
		{
		case 0x00: std::cout << 0x00; // prints "1"
			std::cout << std::setw(33) << std::left << " splice null " << std::endl;
			break;       // and exits the switch
		case 0x04:
			std::cout << std::setw(33) << std::left << " splice schedule " << std::endl;
			break;
		case 0x05:
			std::cout << std::setw(33) << std::left << " splice insert " << std::endl;
			std::cout << std::setw(33) << std::left << " event_id: " << splice_insert_event_id_ << std::endl;
			std::cout << std::setw(33) << std::left << " cancel indicator: " << splice_event_cancel_indicator_ << std::endl;
			break;
		case 0x06:
			std::cout << std::setw(33) << std::left << "time signal " << std::endl;
			break;
		case 0x07:
			std::cout << std::setw(33) << std::left << "bandwidth reservation " << std::endl;
			break;
		}
	}